

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall fmt::Buffer<char>::append<char>(Buffer<char> *this,char *begin,char *end)

{
  char *pcVar1;
  char *pcVar2;
  size_t new_size;
  char *end_local;
  char *begin_local;
  Buffer<char> *this_local;
  
  if (end < begin) {
    __assert_fail("(end >= begin) && \"negative value\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/nuertey[P]spdlog/tests/../include/spdlog/sinks/../fmt/bundled/format.h"
                  ,0x388,"void fmt::Buffer<char>::append(const U *, const U *) [T = char, U = char]"
                 );
  }
  pcVar1 = end + (this->size_ - (long)begin);
  if ((char *)this->capacity_ < pcVar1) {
    (**this->_vptr_Buffer)(this,pcVar1);
  }
  pcVar2 = internal::make_ptr<char>(this->ptr_,this->capacity_);
  std::uninitialized_copy<char_const*,char*>(begin,end,pcVar2 + this->size_);
  this->size_ = (size_t)pcVar1;
  return;
}

Assistant:

void Buffer<T>::append(const U *begin, const U *end)
{
    FMT_ASSERT(end >= begin, "negative value");
    std::size_t new_size = size_ + static_cast<std::size_t>(end - begin);
    if (new_size > capacity_)
        grow(new_size);
    std::uninitialized_copy(begin, end, internal::make_ptr(ptr_, capacity_) + size_);
    size_ = new_size;
}